

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_comparator_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::
SubjectComparatorTest_test_compare_sorts_by_quantity_even_if_first_is_not_in_double_format_Test::
TestBody(SubjectComparatorTest_test_compare_sorts_by_quantity_even_if_first_is_not_in_double_format_Test
         *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_f0;
  Message local_e8;
  int local_e0;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  Message local_c0;
  int local_b8;
  int local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  string local_98 [32];
  string local_78 [8];
  Subject subject2;
  allocator<char> local_49;
  string local_48 [32];
  string local_28 [8];
  Subject subject1;
  SubjectComparatorTest_test_compare_sorts_by_quantity_even_if_first_is_not_in_double_format_Test
  *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_48,"Symbol=EURGBP,Quantity=1000000,Account=AAA",&local_49);
  bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString(local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"Symbol=EURGBP,Quantity=2000000.00,Account=AAA",
             (allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString(local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_b4 = bidfx_public_api::price::subject::SubjectComparatorUtils::Compare
                       ((Subject *)local_28,(Subject *)local_78);
  local_b8 = 0;
  testing::internal::CmpHelperLT<int,int>
            ((internal *)local_b0,"SubjectComparatorUtils::Compare(subject1, subject2)","0",
             &local_b4,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_comparator_test.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_dc = bidfx_public_api::price::subject::SubjectComparatorUtils::Compare
                       ((Subject *)local_78,(Subject *)local_28);
  local_e0 = 0;
  testing::internal::CmpHelperGT<int,int>
            ((internal *)local_d8,"SubjectComparatorUtils::Compare(subject2, subject1)","0",
             &local_dc,&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_comparator_test.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  Subject::~Subject((Subject *)local_78);
  Subject::~Subject((Subject *)local_28);
  return;
}

Assistant:

TEST(SubjectComparatorTest, test_compare_sorts_by_quantity_even_if_first_is_not_in_double_format)
{
    Subject subject1 = SubjectUtils::CreateSubjectFromString("Symbol=EURGBP,Quantity=1000000,Account=AAA");
    Subject subject2 = SubjectUtils::CreateSubjectFromString("Symbol=EURGBP,Quantity=2000000.00,Account=AAA");
    EXPECT_LT(SubjectComparatorUtils::Compare(subject1, subject2), 0);
    EXPECT_GT(SubjectComparatorUtils::Compare(subject2, subject1), 0);
}